

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O2

int Abc_NtkPerformMfs(Abc_Ntk_t *pNtk,Sfm_Par_t *pPars)

{
  int iVar1;
  uint uVar2;
  Sfm_Ntk_t *p;
  Abc_Ntk_t *pAVar3;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMfs.c"
                  ,0xf2,"int Abc_NtkPerformMfs(Abc_Ntk_t *, Sfm_Par_t *)");
  }
  Abc_NtkSweep(pNtk,0);
  pAVar3 = pNtk;
  iVar1 = Abc_NtkGetFaninMax(pNtk);
  if (iVar1 < 7) {
    if ((pNtk->ntkFunc != ABC_FUNC_SOP) && (iVar1 = Abc_NtkToSop(pNtk,-1,1000000000), iVar1 == 0)) {
      puts("Conversion to SOP has failed due to low resource limit.");
      return 0;
    }
    p = Abc_NtkExtractMfs(pNtk,pPars->nFirstFixed);
    uVar2 = Sfm_NtkPerform(p,pPars);
    if ((uVar2 != 0) && (Abc_NtkInsertMfs(pNtk,p), pPars->fVerbose != 0)) {
      Abc_Print((int)pNtk,"The network has %d nodes changed by \"mfs\".\n",(ulong)uVar2);
    }
    Sfm_NtkFree(p);
  }
  else {
    Abc_Print((int)pAVar3,
              "Currently \"mfs\" cannot process the network containing nodes with more than 6 fanins.\n"
             );
  }
  return 1;
}

Assistant:

int Abc_NtkPerformMfs( Abc_Ntk_t * pNtk, Sfm_Par_t * pPars )
{
    Sfm_Ntk_t * p;
    int nFaninMax, nNodes;
    assert( Abc_NtkIsLogic(pNtk) );
    Abc_NtkSweep( pNtk, 0 );
    // count fanouts
    nFaninMax = Abc_NtkGetFaninMax( pNtk );
    if ( nFaninMax > 6 )
    {
        Abc_Print( 1, "Currently \"mfs\" cannot process the network containing nodes with more than 6 fanins.\n" );
        return 1;
    }
    if ( !Abc_NtkHasSop(pNtk) )
        if ( !Abc_NtkToSop( pNtk, -1, ABC_INFINITY ) )
        {
            printf( "Conversion to SOP has failed due to low resource limit.\n" );
            return 0;
        }
    // collect information
    p = Abc_NtkExtractMfs( pNtk, pPars->nFirstFixed );
    // perform optimization
    nNodes = Sfm_NtkPerform( p, pPars );
    if ( nNodes == 0 )
    {
//        Abc_Print( 1, "The network is not changed by \"mfs\".\n" );
    }
    else
    {
        Abc_NtkInsertMfs( pNtk, p );
        if( pPars->fVerbose )
            Abc_Print( 1, "The network has %d nodes changed by \"mfs\".\n", nNodes );
    }
    Sfm_NtkFree( p );
    return 1;
}